

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void memory_listener_unregister_ppc64(MemoryListener *listener)

{
  AddressSpace *pAVar1;
  FlatView *pFVar2;
  anon_union_16_2_aaf24f3d_for_link *paVar3;
  anon_union_16_2_aaf24f3d_for_link_as *paVar4;
  FlatRange *pFVar5;
  MemoryRegionSection local_68;
  
  pAVar1 = listener->address_space;
  if (pAVar1 != (AddressSpace *)0x0) {
    if (listener->begin != (_func_void_MemoryListener_ptr *)0x0) {
      (*listener->begin)(listener);
    }
    pFVar2 = pAVar1->current_map;
    if (pFVar2->nr != 0) {
      pFVar5 = pFVar2->ranges;
      do {
        local_68.size._0_4_ = (undefined4)(pFVar5->addr).size;
        local_68.size._4_4_ = *(undefined4 *)((long)&(pFVar5->addr).size + 4);
        local_68.size._8_4_ = *(undefined4 *)((long)&(pFVar5->addr).size + 8);
        local_68.size._12_4_ = *(undefined4 *)((long)&(pFVar5->addr).size + 0xc);
        local_68.mr = pFVar5->mr;
        local_68.offset_within_region = pFVar5->offset_in_region;
        local_68.fv = pFVar2;
        if (*(long *)((long)&(pFVar5->addr).start + 8) != 0) {
          __assert_fail("r == a",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                        ,0x16,"uint64_t int128_get64(Int128)");
        }
        local_68.offset_within_address_space = (hwaddr)(pFVar5->addr).start;
        local_68.readonly = pFVar5->readonly;
        if (listener->region_del != (_func_void_MemoryListener_ptr_MemoryRegionSection_ptr *)0x0) {
          (*listener->region_del)(listener,&local_68);
        }
        pFVar5 = pFVar5 + 1;
      } while (pFVar5 < pFVar2->ranges + pFVar2->nr);
    }
    if (listener->commit != (_func_void_MemoryListener_ptr *)0x0) {
      (*listener->commit)(listener);
    }
    if ((listener->link).tqe_next == (MemoryListener *)0x0) {
      paVar3 = (anon_union_16_2_aaf24f3d_for_link *)&listener->address_space->uc->memory_listeners;
    }
    else {
      paVar3 = &((listener->link).tqe_next)->link;
    }
    (paVar3->tqe_circ).tql_prev = (listener->link).tqe_circ.tql_prev;
    ((listener->link).tqe_circ.tql_prev)->tql_next = (listener->link).tqe_next;
    (listener->link).tqe_next = (MemoryListener *)0x0;
    (listener->link).tqe_circ.tql_prev = (QTailQLink *)0x0;
    if ((listener->link_as).tqe_next == (MemoryListener *)0x0) {
      paVar4 = (anon_union_16_2_aaf24f3d_for_link_as *)&listener->address_space->listeners;
    }
    else {
      paVar4 = &((listener->link_as).tqe_next)->link_as;
    }
    (paVar4->tqe_circ).tql_prev = (listener->link_as).tqe_circ.tql_prev;
    ((listener->link_as).tqe_circ.tql_prev)->tql_next = (listener->link_as).tqe_next;
    listener->address_space = (AddressSpace *)0x0;
    (listener->link_as).tqe_next = (MemoryListener *)0x0;
    (listener->link_as).tqe_circ.tql_prev = (QTailQLink *)0x0;
  }
  return;
}

Assistant:

void memory_listener_unregister(MemoryListener *listener)
{
    if (!listener->address_space) {
        return;
    }

    listener_del_address_space(listener, listener->address_space);
    QTAILQ_REMOVE(&listener->address_space->uc->memory_listeners, listener, link);
    QTAILQ_REMOVE(&listener->address_space->listeners, listener, link_as);
    listener->address_space = NULL;
}